

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O2

Rwr_Node_t *
Rwr_ManAddNode(Rwr_Man_t *p,Rwr_Node_t *p0,Rwr_Node_t *p1,int fExor,int Level,int Volume)

{
  Rwr_Node_t *pNode;
  uint uVar1;
  uint uVar2;
  
  p->nConsidered = p->nConsidered + 1;
  if (fExor == 0) {
    if (((ulong)p0 & 1) == 0) {
      uVar2 = *(uint *)&p0->field_0xe;
    }
    else {
      uVar2 = ~*(uint *)(((ulong)p0 & 0xfffffffffffffffe) + 0xe);
    }
    if (((ulong)p1 & 1) == 0) {
      uVar1 = *(uint *)&p1->field_0xe;
    }
    else {
      uVar1 = ~*(uint *)(((ulong)p1 & 0xfffffffffffffffe) + 0xe);
    }
    uVar1 = uVar1 & uVar2;
  }
  else {
    uVar1 = *(uint *)&p1->field_0xe ^ *(uint *)&p0->field_0xe;
  }
  uVar2 = uVar1 & 0xffff;
  pNode = (Rwr_Node_t *)Extra_MmFixedEntryFetch(p->pMmNode);
  pNode->Id = p->vForest->nSize;
  pNode->TravId = 0;
  *(uint *)&pNode->field_0xe =
       fExor << 0x1f | (Volume & 0xffU) << 0x10 | (Level & 0x3fU) << 0x18 | uVar2;
  pNode->p0 = p0;
  pNode->p1 = p1;
  pNode->pNext = (Rwr_Node_t *)0x0;
  Vec_PtrPush(p->vForest,pNode);
  if (p->puCanons[uVar2] == (unsigned_short)uVar1) {
    p->nAdded = p->nAdded + 1;
    if (p->pTable[uVar2] == (Rwr_Node_t *)0x0) {
      p->nClasses = p->nClasses + 1;
    }
    Rwr_ListAddToTail(p->pTable,pNode);
  }
  return pNode;
}

Assistant:

Rwr_Node_t * Rwr_ManAddNode( Rwr_Man_t * p, Rwr_Node_t * p0, Rwr_Node_t * p1, int fExor, int Level, int Volume )
{
    Rwr_Node_t * pNew;
    unsigned uTruth;
    // compute truth table, leve, volume
    p->nConsidered++;
    if ( fExor )
        uTruth = (p0->uTruth ^ p1->uTruth);
    else
        uTruth = (Rwr_IsComplement(p0)? ~Rwr_Regular(p0)->uTruth : Rwr_Regular(p0)->uTruth) & 
                 (Rwr_IsComplement(p1)? ~Rwr_Regular(p1)->uTruth : Rwr_Regular(p1)->uTruth) & 0xFFFF;
    // create the new node
    pNew = (Rwr_Node_t *)Extra_MmFixedEntryFetch( p->pMmNode );
    pNew->Id     = p->vForest->nSize;
    pNew->TravId = 0;
    pNew->uTruth = uTruth;
    pNew->Level  = Level;
    pNew->Volume = Volume;
    pNew->fUsed  = 0;
    pNew->fExor  = fExor;
    pNew->p0     = p0;
    pNew->p1     = p1;
    pNew->pNext  = NULL;
    Vec_PtrPush( p->vForest, pNew );
    // do not add if the node is not essential
    if ( uTruth != p->puCanons[uTruth] )
        return pNew;

    // add to the list
    p->nAdded++;
    if ( p->pTable[uTruth] == NULL )
        p->nClasses++;
    Rwr_ListAddToTail( p->pTable + uTruth, pNew );
    return pNew;
}